

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::ContributeGlobalDiagonal
          (TPZDohrSubstruct<std::complex<float>_> *this,
          TPZFMatrix<std::complex<float>_> *StiffnessDiag)

{
  complex<float> *pcVar1;
  complex<float> *pcVar2;
  int64_t iVar3;
  int *piVar4;
  pair<int,_int> *ppVar5;
  long in_RDI;
  int64_t in_stack_00000008;
  TPZManVector<std::complex<float>,_10> *in_stack_00000010;
  pair<int,_int> ind;
  int neqs;
  int i;
  complex<float> *in_stack_ffffffffffffffa8;
  TPZVec<std::complex<float>_> *in_stack_ffffffffffffffb0;
  complex<float> *in_stack_ffffffffffffffb8;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffffc0;
  int local_20;
  int local_14;
  
  TPZManVector<std::complex<float>,_10>::Resize(in_stack_00000010,in_stack_00000008);
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x2b8); local_14 = local_14 + 1) {
    TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator->
              ((TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)(in_RDI + 0x520));
    pcVar1 = TPZMatrix<std::complex<float>_>::operator()
                       (&in_stack_ffffffffffffffc0->super_TPZMatrix<std::complex<float>_>,
                        (int64_t)in_stack_ffffffffffffffb8,(int64_t)in_stack_ffffffffffffffb0);
    pcVar2 = TPZVec<std::complex<float>_>::operator[]
                       ((TPZVec<std::complex<float>_> *)(in_RDI + 0x4b0),(long)local_14);
    pcVar2->_M_value = pcVar1->_M_value;
  }
  if (fWeightType == CorrectWeight) {
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x2b8); local_14 = local_14 + 1) {
      TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator->
                ((TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)(in_RDI + 0x520));
      pcVar1 = TPZMatrix<std::complex<float>_>::operator()
                         (&in_stack_ffffffffffffffc0->super_TPZMatrix<std::complex<float>_>,
                          (int64_t)in_stack_ffffffffffffffb8,(int64_t)in_stack_ffffffffffffffb0);
      pcVar2 = TPZVec<std::complex<float>_>::operator[]
                         ((TPZVec<std::complex<float>_> *)(in_RDI + 0x4b0),(long)local_14);
      pcVar2->_M_value = pcVar1->_M_value;
    }
    local_14 = 0;
    while( true ) {
      in_stack_ffffffffffffffc0 = (TPZFMatrix<std::complex<float>_> *)(long)local_14;
      iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x2c0));
      if (iVar3 <= (long)in_stack_ffffffffffffffc0) break;
      in_stack_ffffffffffffffb8 =
           TPZFMatrix<std::complex<float>_>::operator()
                     (in_stack_ffffffffffffffc0,(int64_t)in_stack_ffffffffffffffb8,
                      (int64_t)in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffb0 = (TPZVec<std::complex<float>_> *)(in_RDI + 0x4b0);
      piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x2c0),(long)local_14);
      pcVar1 = TPZVec<std::complex<float>_>::operator[](in_stack_ffffffffffffffb0,(long)*piVar4);
      pcVar1->_M_value = in_stack_ffffffffffffffb8->_M_value;
      local_14 = local_14 + 1;
    }
  }
  else {
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x2b8); local_14 = local_14 + 1) {
      pcVar1 = TPZVec<std::complex<float>_>::operator[]
                         ((TPZVec<std::complex<float>_> *)(in_RDI + 0x4b0),(long)local_14);
      std::complex<float>::operator=(pcVar1,1.0);
    }
    local_14 = 0;
    while( true ) {
      in_stack_ffffffffffffffa8 = (complex<float> *)(long)local_14;
      iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x2c0));
      if (iVar3 <= (long)in_stack_ffffffffffffffa8) break;
      piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x2c0),(long)local_14);
      pcVar1 = TPZVec<std::complex<float>_>::operator[]
                         ((TPZVec<std::complex<float>_> *)(in_RDI + 0x4b0),(long)*piVar4);
      std::complex<float>::operator=(pcVar1,1.0);
      local_14 = local_14 + 1;
    }
  }
  iVar3 = TPZVec<std::pair<int,_int>_>::NElements((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5d8));
  for (local_14 = 0; local_14 < (int)iVar3; local_14 = local_14 + 1) {
    ppVar5 = TPZVec<std::pair<int,_int>_>::operator[]
                       ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x5d8),(long)local_14);
    local_20 = (*ppVar5).first;
    TPZVec<std::complex<float>_>::operator[]
              ((TPZVec<std::complex<float>_> *)(in_RDI + 0x4b0),(long)local_20);
    TPZFMatrix<std::complex<float>_>::operator()
              (in_stack_ffffffffffffffc0,(int64_t)in_stack_ffffffffffffffb8,
               (int64_t)in_stack_ffffffffffffffb0);
    std::complex<float>::operator+=
              ((complex<float> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ContributeGlobalDiagonal(TPZFMatrix<TVar> &StiffnessDiag) {
	int i;
	fWeights.Resize(fNEquations);
	//fWeights = diag(kci) if u(i) is on coarse or diag(Ki)
	for (i=0;i<fNEquations;i++) {
		fWeights[i] = fStiffness->operator()(i,i);
	}
	if(fWeightType == CorrectWeight)
	{
		for (i=0;i<fNEquations;i++) {
			fWeights[i] = fStiffness->operator()(i,i);
		}
		for (i=0;i<fCoarseNodes.NElements();i++) {
			fWeights[fCoarseNodes[i]] = fKCi(i,i);
		}
	} else {
		for (i=0;i<fNEquations;i++) {
			fWeights[i] = 1.;
		}
		for (i=0;i<fCoarseNodes.NElements();i++) {
			fWeights[fCoarseNodes[i]] = 1.;
		}
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weight used for assembly" << fWeights;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		StiffnessDiag(ind.second,0) += fWeights[ind.first];
	}
}